

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  uint8_t c;
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int local_60;
  int local_5c;
  int i_1;
  int i;
  uint8_t *line_end;
  uint8_t *line;
  uint8_t *end;
  uint8_t *p;
  char *prefix_local;
  PrintChars print_chars_local;
  size_t offset_local;
  size_t size_local;
  void *start_local;
  Stream *this_local;
  
  puVar3 = (uint8_t *)((long)start + size);
  end = (uint8_t *)start;
  while (puVar1 = end, end < puVar3) {
    puVar4 = end + 0x10;
    if (prefix != (char *)0x0) {
      Writef(this,"%s",prefix);
    }
    Writef(this,"%07zx: ",end + (offset - (long)start));
    while (end < puVar4) {
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        if (end < puVar3) {
          Writef(this,"%02x",(ulong)*end);
        }
        else {
          WriteChar(this,' ',(char *)0x0,No);
          WriteChar(this,' ',(char *)0x0,No);
        }
        end = end + 1;
      }
      WriteChar(this,' ',(char *)0x0,No);
    }
    if (print_chars == Yes) {
      WriteChar(this,' ',(char *)0x0,No);
      end = puVar1;
      for (local_60 = 0; local_60 < 0x10 && end < puVar3; local_60 = local_60 + 1) {
        iVar2 = isprint((uint)*end);
        if (iVar2 == 0) {
          c = '.';
        }
        else {
          c = *end;
        }
        WriteChar(this,c,(char *)0x0,No);
        end = end + 1;
      }
    }
    if ((puVar3 <= end) && (desc != (char *)0x0)) {
      Writef(this,"  ; %s",desc);
    }
    WriteChar(this,'\n',(char *)0x0,No);
  }
  return;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}